

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,bool isDerivedByList,int finalSet,bool isUserDefined,
          MemoryManager *userManager)

{
  short *psVar1;
  short *psVar2;
  ushort uVar3;
  ValidatorType VVar4;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> **ppRVar5;
  undefined2 *puVar6;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *this_00;
  XMLSize_t XVar7;
  int iVar8;
  ListDatatypeValidator *this_01;
  ulong uVar9;
  ulong uVar10;
  undefined4 extraout_var;
  KVStringPair *pKVar11;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> *pRVar12;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_02;
  undefined4 extraout_var_00;
  XMLSize_t XVar13;
  long lVar14;
  bool bVar15;
  ushort *puVar16;
  MemoryManager *manager;
  
  if (baseValidator == (DatatypeValidator *)0x0) {
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::~RefHashTableOf(facets);
      XMemory::operator_delete((XMemory *)facets,typeName);
    }
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])(enums);
    }
    return (DatatypeValidator *)0x0;
  }
  manager = userManager;
  if (!isUserDefined) {
    manager = XMLPlatformUtils::fgMemoryManager;
  }
  if (isDerivedByList) {
    this_01 = (ListDatatypeValidator *)XMemory::operator_new(0x98,manager);
    ListDatatypeValidator::ListDatatypeValidator
              (this_01,baseValidator,facets,enums,finalSet,manager);
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fOrdered = ORDERED_FALSE;
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fNumeric = false;
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      uVar10 = facets->fHashModulus;
      uVar9 = 0x6c;
      uVar3 = 0x65;
      puVar16 = &DAT_003680ec;
      do {
        uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
        uVar3 = *puVar16;
        puVar16 = puVar16 + 1;
      } while (uVar3 != 0);
      ppRVar5 = facets->fBucketList;
      for (pRVar12 = ppRVar5[uVar9 % uVar10];
          pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
          pRVar12 = pRVar12->fNext) {
        puVar6 = (undefined2 *)pRVar12->fKey;
        if (puVar6 == &SchemaSymbols::fgELT_LENGTH) {
LAB_002f4adc:
          if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4ae2;
          break;
        }
        if (puVar6 != (undefined2 *)0x0) {
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_LENGTH + lVar14);
            if (*psVar1 == 0) {
              if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4adc;
              break;
            }
            psVar2 = (short *)((long)puVar6 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      uVar9 = 0x6d;
      uVar3 = 0x69;
      puVar16 = &DAT_003681a4;
      do {
        uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
        uVar3 = *puVar16;
        puVar16 = puVar16 + 1;
      } while (uVar3 != 0);
      pRVar12 = ppRVar5[uVar9 % uVar10];
LAB_002f4dad:
      if (pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) {
        puVar6 = (undefined2 *)pRVar12->fKey;
        if (puVar6 != &SchemaSymbols::fgELT_MINLENGTH) goto code_r0x002f4dbf;
LAB_002f4df7:
        if (pRVar12->fData != (KVStringPair *)0x0) {
          uVar9 = 0x6d;
          uVar3 = 0x61;
          puVar16 = &DAT_00368144;
          do {
            uVar9 = (ulong)uVar3 + (uVar9 >> 0x18) + uVar9 * 0x26;
            uVar3 = *puVar16;
            puVar16 = puVar16 + 1;
          } while (uVar3 != 0);
          for (pRVar12 = ppRVar5[uVar9 % uVar10];
              pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
              pRVar12 = pRVar12->fNext) {
            puVar6 = (undefined2 *)pRVar12->fKey;
            if (puVar6 == &SchemaSymbols::fgELT_MAXLENGTH) {
LAB_002f5175:
              if (pRVar12->fData != (KVStringPair *)0x0) {
LAB_002f4ae2:
                (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = true;
                (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = true;
                goto LAB_002f5187;
              }
              break;
            }
            if (puVar6 != (undefined2 *)0x0) {
              lVar14 = 0;
              do {
                psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXLENGTH + lVar14);
                if (*psVar1 == 0) {
                  if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f5175;
                  break;
                }
                psVar2 = (short *)((long)puVar6 + lVar14);
                lVar14 = lVar14 + 2;
              } while (*psVar1 == *psVar2);
            }
          }
        }
      }
    }
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = false;
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = false;
    goto LAB_002f5187;
  }
  if ((facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) &&
     (baseValidator->fType != String)) {
    uVar10 = 0x77;
    uVar3 = 0x68;
    puVar16 = &DAT_00368084;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar16;
      puVar16 = puVar16 + 1;
    } while (uVar3 != 0);
    for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar12 = pRVar12->fNext) {
      puVar6 = (undefined2 *)pRVar12->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_WHITESPACE) {
LAB_002f4b8f:
        if (pRVar12->fData != (KVStringPair *)0x0) {
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::removeKey
                    (facets,&SchemaSymbols::fgELT_WHITESPACE);
        }
        break;
      }
      if (puVar6 != (undefined2 *)0x0) {
        lVar14 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_WHITESPACE + lVar14);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4b8f;
            break;
          }
          psVar2 = (short *)((long)puVar6 + lVar14);
          lVar14 = lVar14 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
  }
  iVar8 = (*(baseValidator->super_XSerializable)._vptr_XSerializable[0xb])
                    (baseValidator,facets,enums,(ulong)(uint)finalSet,manager);
  this_01 = (ListDatatypeValidator *)CONCAT44(extraout_var,iVar8);
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fOrdered =
       baseValidator->fOrdered;
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fNumeric =
       baseValidator->fNumeric;
  if (facets == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
LAB_002f4f78:
    bVar15 = false;
  }
  else {
    this_00 = baseValidator->fFacets;
    uVar10 = 0x6d;
    uVar3 = 0x69;
    puVar16 = &DAT_00368184;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar16;
      puVar16 = puVar16 + 1;
    } while (uVar3 != 0);
    for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar12 = pRVar12->fNext) {
      puVar6 = (undefined2 *)pRVar12->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_MININCLUSIVE) {
LAB_002f4c7b:
        if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4d52;
        break;
      }
      if (puVar6 != (undefined2 *)0x0) {
        lVar14 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_MININCLUSIVE + lVar14);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4c7b;
            break;
          }
          psVar2 = (short *)((long)puVar6 + lVar14);
          lVar14 = lVar14 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    uVar10 = 0x6d;
    uVar3 = 0x69;
    puVar16 = &DAT_00368164;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar16;
      puVar16 = puVar16 + 1;
    } while (uVar3 != 0);
    for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar12 = pRVar12->fNext) {
      puVar6 = (undefined2 *)pRVar12->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_MINEXCLUSIVE) {
LAB_002f4d17:
        if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4d52;
        break;
      }
      if (puVar6 != (undefined2 *)0x0) {
        lVar14 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_MINEXCLUSIVE + lVar14);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4d17;
            break;
          }
          psVar2 = (short *)((long)puVar6 + lVar14);
          lVar14 = lVar14 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    if ((this_00 == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) ||
       ((pKVar11 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                             (this_00,&SchemaSymbols::fgELT_MININCLUSIVE),
        pKVar11 == (KVStringPair *)0x0 &&
        (pKVar11 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                             (this_00,&SchemaSymbols::fgELT_MINEXCLUSIVE),
        pKVar11 == (KVStringPair *)0x0)))) goto LAB_002f4f78;
LAB_002f4d52:
    uVar10 = 0x6d;
    uVar3 = 0x61;
    puVar16 = &DAT_00368124;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar16;
      puVar16 = puVar16 + 1;
    } while (uVar3 != 0);
    for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar12 = pRVar12->fNext) {
      puVar6 = (undefined2 *)pRVar12->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_MAXINCLUSIVE) {
LAB_002f4ea3:
        bVar15 = true;
        if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4f7a;
        break;
      }
      if (puVar6 != (undefined2 *)0x0) {
        lVar14 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXINCLUSIVE + lVar14);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4ea3;
            break;
          }
          psVar2 = (short *)((long)puVar6 + lVar14);
          lVar14 = lVar14 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    uVar10 = 0x6d;
    uVar3 = 0x61;
    puVar16 = &DAT_00368104;
    do {
      uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
      uVar3 = *puVar16;
      puVar16 = puVar16 + 1;
    } while (uVar3 != 0);
    for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
        pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
        pRVar12 = pRVar12->fNext) {
      puVar6 = (undefined2 *)pRVar12->fKey;
      if (puVar6 == &SchemaSymbols::fgELT_MAXEXCLUSIVE) {
LAB_002f4f41:
        bVar15 = true;
        if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4f7a;
        break;
      }
      if (puVar6 != (undefined2 *)0x0) {
        lVar14 = 0;
        do {
          psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXEXCLUSIVE + lVar14);
          if (*psVar1 == 0) {
            if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4f41;
            break;
          }
          psVar2 = (short *)((long)puVar6 + lVar14);
          lVar14 = lVar14 + 2;
        } while (*psVar1 == *psVar2);
      }
    }
    if (this_00 == (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0)
    goto LAB_002f4f78;
    pKVar11 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                        (this_00,&SchemaSymbols::fgELT_MAXINCLUSIVE);
    bVar15 = true;
    if ((pKVar11 == (KVStringPair *)0x0) &&
       (pKVar11 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                            (this_00,&SchemaSymbols::fgELT_MAXEXCLUSIVE),
       pKVar11 == (KVStringPair *)0x0)) goto LAB_002f4f78;
  }
LAB_002f4f7a:
  (this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded = bVar15;
  if (baseValidator->fFinite == true) {
LAB_002f4f85:
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = true;
  }
  else {
    if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
      uVar10 = 0x6c;
      uVar3 = 0x65;
      puVar16 = &DAT_003680ec;
      do {
        uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
        uVar3 = *puVar16;
        puVar16 = puVar16 + 1;
      } while (uVar3 != 0);
      for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
          pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
          pRVar12 = pRVar12->fNext) {
        puVar6 = (undefined2 *)pRVar12->fKey;
        if (puVar6 == &SchemaSymbols::fgELT_LENGTH) {
LAB_002f5037:
          if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4f85;
          break;
        }
        if (puVar6 != (undefined2 *)0x0) {
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_LENGTH + lVar14);
            if (*psVar1 == 0) {
              if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f5037;
              break;
            }
            psVar2 = (short *)((long)puVar6 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      uVar10 = 0x6d;
      uVar3 = 0x61;
      puVar16 = &DAT_00368144;
      do {
        uVar10 = (ulong)uVar3 + (uVar10 >> 0x18) + uVar10 * 0x26;
        uVar3 = *puVar16;
        puVar16 = puVar16 + 1;
      } while (uVar3 != 0);
      for (pRVar12 = facets->fBucketList[uVar10 % facets->fHashModulus];
          pRVar12 != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
          pRVar12 = pRVar12->fNext) {
        puVar6 = (undefined2 *)pRVar12->fKey;
        if (puVar6 == &SchemaSymbols::fgELT_MAXLENGTH) {
LAB_002f50d3:
          if (pRVar12->fData != (KVStringPair *)0x0) goto LAB_002f4f85;
          break;
        }
        if (puVar6 != (undefined2 *)0x0) {
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)&SchemaSymbols::fgELT_MAXLENGTH + lVar14);
            if (*psVar1 == 0) {
              if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f50d3;
              break;
            }
            psVar2 = (short *)((long)puVar6 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      pKVar11 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                          (facets,&SchemaSymbols::fgELT_TOTALDIGITS);
      if ((pKVar11 != (KVStringPair *)0x0) ||
         (((((this_01->super_AbstractStringValidator).super_DatatypeValidator.fBounded != false ||
            (VVar4 = (this_01->super_AbstractStringValidator).super_DatatypeValidator.fType,
            VVar4 - MonthDay < 5)) || (VVar4 == Date)) &&
          (pKVar11 = RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::get
                               (facets,&SchemaSymbols::fgELT_FRACTIONDIGITS),
          pKVar11 != (KVStringPair *)0x0)))) goto LAB_002f4f85;
    }
    (this_01->super_AbstractStringValidator).super_DatatypeValidator.fFinite = false;
  }
LAB_002f5187:
  this_02 = fBuiltInRegistry;
  if ((isUserDefined) &&
     (this_02 = this->fUserDefinedRegistry,
     this->fUserDefinedRegistry ==
     (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0)) {
    this_02 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
              XMemory::operator_new(0x38,userManager);
    this_02->fMemoryManager = userManager;
    this_02->fAdoptedElems = true;
    this_02->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)0x0;
    this_02->fHashModulus = 0x1d;
    this_02->fInitialModulus = 0x1d;
    this_02->fCount = 0;
    iVar8 = (*userManager->_vptr_MemoryManager[3])(userManager,0xe8);
    this_02->fBucketList =
         (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)CONCAT44(extraout_var_00,iVar8);
    XVar7 = this_02->fHashModulus;
    if (XVar7 != 0) {
      XVar13 = 0;
      do {
        this_02->fBucketList[XVar13] = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0
        ;
        XVar13 = XVar13 + 1;
      } while (XVar7 != XVar13);
    }
    this->fUserDefinedRegistry = this_02;
  }
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
            (this_02,typeName,(DatatypeValidator *)this_01);
  DatatypeValidator::setTypeName((DatatypeValidator *)this_01,typeName);
  return (DatatypeValidator *)this_01;
code_r0x002f4dbf:
  if (puVar6 != (undefined2 *)0x0) {
    lVar14 = 0;
    do {
      psVar1 = (short *)((long)&SchemaSymbols::fgELT_MINLENGTH + lVar14);
      if (*psVar1 == 0) {
        if (*(short *)((long)puVar6 + lVar14) == 0) goto LAB_002f4df7;
        break;
      }
      psVar2 = (short *)((long)puVar6 + lVar14);
      lVar14 = lVar14 + 2;
    } while (*psVar1 == *psVar2);
  }
  pRVar12 = pRVar12->fNext;
  goto LAB_002f4dad;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                  typeName
	, DatatypeValidator* const            baseValidator
    , RefHashTableOf<KVStringPair>* const facets
    , RefArrayVectorOf<XMLCh>* const      enums
    , const bool                          isDerivedByList
    , const int                           finalSet
    , const bool                          isUserDefined
    , MemoryManager* const                userManager
)
{
	if (baseValidator == 0) {

        if (facets) {
            Janitor<KVStringPairHashTable> janFacets(facets);
        }

        if (enums) {
            Janitor<XMLChRefVector> janEnums(enums);
        }

        return 0;
    }

	DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (isUserDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    if (isDerivedByList) {
        datatypeValidator = new (manager) ListDatatypeValidator(baseValidator, facets, enums, finalSet, manager);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
        datatypeValidator->setNumeric(false);
        if (facets &&
             ((facets->get(SchemaSymbols::fgELT_LENGTH) ||
              (facets->get(SchemaSymbols::fgELT_MINLENGTH) && facets->get(SchemaSymbols::fgELT_MAXLENGTH)))))
        {
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
            datatypeValidator->setFinite(false);
        }
    }
    else {

        if ((baseValidator->getType() != DatatypeValidator::String) && facets) {

            KVStringPair* value = facets->get(SchemaSymbols::fgELT_WHITESPACE);

            if (value != 0) {
                facets->removeKey(SchemaSymbols::fgELT_WHITESPACE);
            }
        }

        datatypeValidator = baseValidator->newInstance
        (
            facets
            , enums
            , finalSet
            , manager
        );

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        datatypeValidator->setOrdered(baseValidator->getOrdered());
        datatypeValidator->setNumeric(baseValidator->getNumeric());
        RefHashTableOf<KVStringPair>* baseFacets = baseValidator->getFacets();
        if (facets  &&
            ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE) ||
              (baseFacets && (baseFacets->get(SchemaSymbols::fgELT_MININCLUSIVE) ||
                              baseFacets->get(SchemaSymbols::fgELT_MINEXCLUSIVE))))) &&
             (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
              facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE) ||
              (baseFacets && ((baseFacets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) ||
                               baseFacets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE))))))
        {
            datatypeValidator->setBounded(true);
        }
        else
        {
            datatypeValidator->setBounded(false);
        }
        if (baseValidator->getFinite())
        {
            datatypeValidator->setFinite(true);
        }
        else if (!facets)
        {
            datatypeValidator->setFinite(false);
        }
        else if (facets->get(SchemaSymbols::fgELT_LENGTH) || facets->get(SchemaSymbols::fgELT_MAXLENGTH) ||
                 facets->get(SchemaSymbols::fgELT_TOTALDIGITS))
        {
            datatypeValidator->setFinite(true);
        }
        //for efficiency use this instead of rechecking...
        //else if ((facets->get(SchemaSymbols::fgELT_MININCLUSIVE) || facets->get(SchemaSymbols::fgELT_MINEXCLUSIVE)) &&
        //         (facets->get(SchemaSymbols::fgELT_MAXINCLUSIVE) || facets->get(SchemaSymbols::fgELT_MAXEXCLUSIVE)))
        else if (datatypeValidator->getBounded() ||
                 datatypeValidator->getType() == DatatypeValidator::Date      ||
                 datatypeValidator->getType() == DatatypeValidator::YearMonth ||
                 datatypeValidator->getType() == DatatypeValidator::Year      ||
                 datatypeValidator->getType() == DatatypeValidator::MonthDay  ||
                 datatypeValidator->getType() == DatatypeValidator::Day       ||
                 datatypeValidator->getType() == DatatypeValidator::Month)
        {
            if (facets->get(SchemaSymbols::fgELT_FRACTIONDIGITS))
            {
                datatypeValidator->setFinite(true);
            }
            else
            {
                datatypeValidator->setFinite(false);
            }
        }
        else
        {
            datatypeValidator->setFinite(false);
        }
    }

    if (datatypeValidator != 0) {

        if (isUserDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }

        datatypeValidator->setTypeName(typeName);
    }

    return datatypeValidator;
}